

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-dark.c
# Opt level: O0

void borg_flow_direct(int y,int x)

{
  int iVar1;
  int iVar2;
  _Bool _Var3;
  wchar_t wVar4;
  borg_grid *ag_00;
  int local_60;
  int local_5c;
  int local_54;
  int local_50;
  int local_48;
  int local_44;
  borg_grid *ag;
  int fear;
  int p;
  int shift;
  int ax;
  int ay;
  int y2;
  int x2;
  int y1;
  int x1;
  int n;
  int x_local;
  int y_local;
  
  y1 = 0;
  ag._0_4_ = L'\0';
  if (borg_data_icky->data[y][x] != '\0') {
    return;
  }
  if (borg_data_know->data[y][x] == '\0') {
    borg_data_know->data[y][x] = '\x01';
    wVar4 = borg_danger(y,x,L'\x01',true,false);
    if (borg.trait[0x24] == 0x32) {
      ag._0_4_ = (avoidance * 5) / 10;
    }
    if (borg.trait[0x24] != 0x32) {
      ag._0_4_ = (avoidance * 3) / 10;
    }
    if ((scaryguy_on_level & 1U) != 0) {
      ag._0_4_ = (int)avoidance << 1;
    }
    if (((unique_on_level != 0) && ((vault_on_level & 1U) != 0)) && (borg.trait[0x24] == 0x32)) {
      ag._0_4_ = avoidance * 3;
    }
    if (((scaryguy_on_level & 1U) != 0) && (borg.trait[0x23] < 6)) {
      ag._0_4_ = avoidance * 3;
    }
    if ((borg.goal.ignoring & 1U) != 0) {
      ag._0_4_ = avoidance * 5;
    }
    if (5000 < borg_t - borg_began) {
      ag._0_4_ = avoidance * 0x19;
    }
    if (borg.trait[0x27] == 0) {
      ag._0_4_ = avoidance * 100;
    }
    if (borg.trait[0x23] == 0) {
      ag._0_4_ = (int)avoidance / 10;
    }
    if ((wchar_t)ag < wVar4) {
      borg_data_icky->data[y][x] = '\x01';
      return;
    }
  }
  borg_data_cost->data[y][x] = '\0';
  iVar2 = borg.c.y;
  iVar1 = borg.c.x;
  if (borg.c.y < y) {
    local_44 = y - borg.c.y;
  }
  else {
    local_44 = borg.c.y - y;
  }
  x1 = x;
  n = y;
  if (borg.c.x < x) {
    local_48 = x - borg.c.x;
  }
  else {
    local_48 = borg.c.x - x;
  }
  do {
    if ((x1 == iVar1) && (n == iVar2)) {
      return;
    }
    y1 = y1 + 1;
    if (local_48 < local_44) {
      local_50 = (y1 * local_48 + (local_44 + -1) / 2) / local_44;
      if (iVar1 < x) {
        local_50 = -local_50;
      }
      local_50 = x + local_50;
      x1 = local_50;
      local_54 = y1;
      if (iVar2 < y) {
        local_54 = -y1;
      }
      local_54 = y + local_54;
      n = local_54;
    }
    else {
      local_5c = (y1 * local_44 + (local_48 + -1) / 2) / local_48;
      if (iVar2 < y) {
        local_5c = -local_5c;
      }
      local_5c = y + local_5c;
      n = local_5c;
      local_60 = y1;
      if (iVar1 < x) {
        local_60 = -y1;
      }
      local_60 = x + local_60;
      x1 = local_60;
    }
    ag_00 = borg_grids[n] + x1;
    _Var3 = borg_cave_floor_grid(ag_00);
    if (!_Var3) {
      return;
    }
    if ((ag_00->feat == '\x17') && (borg.trait[0x40] == 0)) {
      return;
    }
    if ((((ag_00->trap & 1U) != 0) && ((int)avoidance <= borg.trait[0x1b])) &&
       ((scaryguy_on_level & 1U) == 0)) {
      if (borg.trait[0x1b] < 0x3c) {
        return;
      }
      if ((borg.trait[0x36] < 0x1e) && (borg.trait[0x23] < 0x14)) {
        return;
      }
      if ((borg.trait[0x36] < 0x2d) && (borg.trait[0x23] < 10)) {
        return;
      }
      if ((borg.trait[0x37] < 0x1e) && (borg.trait[0x23] < 0x14)) {
        return;
      }
      if ((borg.trait[0x37] < 0x2d) && (borg.trait[0x23] < 10)) {
        return;
      }
    }
    if (borg_data_icky->data[n][x1] != '\0') {
      return;
    }
    if (borg_data_know->data[n][x1] == '\0') {
      borg_data_know->data[n][x1] = '\x01';
      wVar4 = borg_danger(n,x1,L'\x01',true,false);
      if (borg.trait[0x24] == 0x32) {
        ag._0_4_ = (avoidance * 5) / 10;
      }
      if (borg.trait[0x24] != 0x32) {
        ag._0_4_ = (avoidance * 3) / 10;
      }
      if ((scaryguy_on_level & 1U) != 0) {
        ag._0_4_ = (int)avoidance << 1;
      }
      if (((unique_on_level != 0) && ((vault_on_level & 1U) != 0)) && (borg.trait[0x24] == 0x32)) {
        ag._0_4_ = avoidance * 3;
      }
      if (((scaryguy_on_level & 1U) != 0) && (borg.trait[0x23] < 6)) {
        ag._0_4_ = avoidance * 3;
      }
      if ((borg.goal.ignoring & 1U) != 0) {
        ag._0_4_ = avoidance * 5;
      }
      if (5000 < borg_t - borg_began) {
        ag._0_4_ = avoidance * 0x19;
      }
      if (borg.trait[0x27] == 0) {
        ag._0_4_ = avoidance * 100;
      }
      if (borg.trait[0x23] == 0) {
        ag._0_4_ = (int)avoidance / 10;
      }
      if ((wchar_t)ag < wVar4) {
        borg_data_icky->data[n][x1] = '\x01';
        return;
      }
    }
    if ((int)(uint)borg_data_cost->data[n][x1] <= y1) {
      return;
    }
    borg_data_cost->data[n][x1] = (uint8_t)y1;
  } while( true );
}

Assistant:

static void borg_flow_direct(int y, int x)
{
    int n = 0;

    int x1, y1, x2, y2;

    int ay, ax;

    int shift;

    int p, fear = 0;

    borg_grid *ag;

    /* Avoid icky grids */
    if (borg_data_icky->data[y][x])
        return;

    /* Unknown */
    if (!borg_data_know->data[y][x]) {
        /* Mark as known */
        borg_data_know->data[y][x] = true;

        /* Get the danger */
        p = borg_danger(y, x, 1, true, false);

        /* Increase bravery */
        if (borg.trait[BI_MAXCLEVEL] == 50)
            fear = avoidance * 5 / 10;
        if (borg.trait[BI_MAXCLEVEL] != 50)
            fear = avoidance * 3 / 10;
        if (scaryguy_on_level)
            fear = avoidance * 2;
        if (unique_on_level && vault_on_level && borg.trait[BI_MAXCLEVEL] == 50)
            fear = avoidance * 3;
        if (scaryguy_on_level && borg.trait[BI_CLEVEL] <= 5)
            fear = avoidance * 3;
        if (borg.goal.ignoring)
            fear = avoidance * 5;
        if (borg_t - borg_began > 5000)
            fear = avoidance * 25;
        if (borg.trait[BI_FOOD] == 0)
            fear = avoidance * 100;

        /* Normal in town */
        if (borg.trait[BI_CLEVEL] == 0)
            fear = avoidance * 1 / 10;

        /* Mark dangerous grids as icky */
        if (p > fear) {
            /* Icky */
            borg_data_icky->data[y][x] = true;

            /* Avoid */
            return;
        }
    }

    /* Save the flow cost (zero) */
    borg_data_cost->data[y][x] = 0;

    /* Save "origin" */
    y1 = y;
    x1 = x;

    /* Save "destination" */
    y2 = borg.c.y;
    x2 = borg.c.x;

    /* Calculate distance components */
    ay = (y2 < y1) ? (y1 - y2) : (y2 - y1);
    ax = (x2 < x1) ? (x1 - x2) : (x2 - x1);

    /* Path */
    while (1) {
        /* Check for arrival at player */
        if ((x == x2) && (y == y2))
            return;

        /* Next */
        n++;

        /* Move mostly vertically */
        if (ay > ax) {
            /* Extract a shift factor XXX */
            shift = (n * ax + (ay - 1) / 2) / ay;

            /* Sometimes move along the minor axis */
            x = (x2 < x1) ? (x1 - shift) : (x1 + shift);

            /* Always move along major axis */
            y = (y2 < y1) ? (y1 - n) : (y1 + n);
        }

        /* Move mostly horizontally */
        else {
            /* Extract a shift factor XXX */
            shift = (n * ay + (ax - 1) / 2) / ax;

            /* Sometimes move along the minor axis */
            y = (y2 < y1) ? (y1 - shift) : (y1 + shift);

            /* Always move along major axis */
            x = (x2 < x1) ? (x1 - n) : (x1 + n);
        }

        /* Access the grid */
        ag = &borg_grids[y][x];

        /* Ignore "wall" grids and lava (unless immune to fire) */
        if (!borg_cave_floor_grid(ag)
            || (ag->feat == FEAT_LAVA && !borg.trait[BI_IFIRE]))
            return;

        /* Avoid Traps if low level-- unless brave or scaryguy. */
        if (ag->trap && avoidance <= borg.trait[BI_CURHP]
            && !scaryguy_on_level) {
            /* Do not disarm when you could end up dead */
            if (borg.trait[BI_CURHP] < 60)
                return;

            /* Do not disarm when clumsy */
            if (borg.trait[BI_DISP] < 30 && borg.trait[BI_CLEVEL] < 20)
                return;
            if (borg.trait[BI_DISP] < 45 && borg.trait[BI_CLEVEL] < 10)
                return;
            if (borg.trait[BI_DISM] < 30 && borg.trait[BI_CLEVEL] < 20)
                return;
            if (borg.trait[BI_DISM] < 45 && borg.trait[BI_CLEVEL] < 10)
                return;
        }

        /* Abort at "icky" grids */
        if (borg_data_icky->data[y][x])
            return;

        /* Analyze every grid once */
        if (!borg_data_know->data[y][x]) {
            /* Mark as known */
            borg_data_know->data[y][x] = true;

            /* Get the danger */
            p = borg_danger(y, x, 1, true, false);

            /* Increase bravery */
            if (borg.trait[BI_MAXCLEVEL] == 50)
                fear = avoidance * 5 / 10;
            if (borg.trait[BI_MAXCLEVEL] != 50)
                fear = avoidance * 3 / 10;
            if (scaryguy_on_level)
                fear = avoidance * 2;
            if (unique_on_level && vault_on_level
                && borg.trait[BI_MAXCLEVEL] == 50)
                fear = avoidance * 3;
            if (scaryguy_on_level && borg.trait[BI_CLEVEL] <= 5)
                fear = avoidance * 3;
            if (borg.goal.ignoring)
                fear = avoidance * 5;
            if (borg_t - borg_began > 5000)
                fear = avoidance * 25;
            if (borg.trait[BI_FOOD] == 0)
                fear = avoidance * 100;

            /* Normal in town */
            if (borg.trait[BI_CLEVEL] == 0)
                fear = avoidance * 1 / 10;

            /* Avoid dangerous grids (forever) */
            if (p > fear) {
                /* Mark as icky */
                borg_data_icky->data[y][x] = true;

                /* Abort */
                return;
            }
        }

        /* Abort "pointless" paths if possible */
        if (borg_data_cost->data[y][x] <= n)
            break;

        /* Save the new flow cost */
        borg_data_cost->data[y][x] = n;
    }
}